

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O3

bool __thiscall ON_NurbsCage::IsParallelogram(ON_NurbsCage *this,double tolerance)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  ON_Interval *this_00;
  long lVar8;
  double dVar9;
  double dVar10;
  double d;
  double t;
  double d_00;
  double dVar11;
  double d_01;
  ON_Interval OVar12;
  ON_3dPoint B;
  ON_3dPoint Q;
  ON_3dPoint Z;
  ON_3dPoint Y;
  ON_3dPoint X;
  ON_3dPoint P;
  ON_3dPoint local_1a8;
  ON_Interval local_188 [3];
  ON_3dPoint local_150;
  ON_3dPoint local_138;
  ON_3dPoint local_120;
  ON_3dPoint local_108;
  ON_3dPoint local_f0;
  ON_3dPoint local_d8;
  ON_3dPoint local_c0;
  ON_3dPoint local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  lVar7 = 0;
  do {
    ON_Interval::ON_Interval((ON_Interval *)((long)local_188[0].m_t + lVar7));
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x30);
  bVar6 = false;
  iVar1 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(this,0);
  if ((char)iVar1 != '\0') {
    this_00 = local_188;
    uVar5 = 0;
    while( true ) {
      OVar12 = Domain(this,(int)uVar5);
      *&this_00->m_t = OVar12.m_t;
      pdVar2 = ON_Interval::operator[](this_00,0);
      if (*pdVar2 != *this->m_knot[uVar5]) {
        return false;
      }
      if (NAN(*pdVar2) || NAN(*this->m_knot[uVar5])) {
        return false;
      }
      pdVar2 = ON_Interval::operator[](this_00,1);
      dVar9 = *pdVar2;
      dVar10 = this->m_knot[uVar5][(long)this->m_order[uVar5] + (long)this->m_cv_count[uVar5] + -3];
      if (1 < uVar5) break;
      uVar5 = uVar5 + 1;
      this_00 = this_00 + 1;
      if ((dVar9 != dVar10) || (NAN(dVar9) || NAN(dVar10))) break;
    }
    if ((dVar9 != dVar10) || (NAN(dVar9) || NAN(dVar10))) {
LAB_0054d2ed:
      bVar6 = false;
    }
    else {
      GetCV(this,0,0,0,&local_d8);
      iVar1 = this->m_cv_count[0];
      GetCV(this,iVar1 + -1,0,0,&local_f0);
      GetCV(this,0,this->m_cv_count[1] + -1,0,&local_108);
      GetCV(this,0,0,this->m_cv_count[2] + -1,&local_120);
      bVar6 = true;
      if (0 < iVar1) {
        dVar9 = 2.3283064365386963e-10;
        if (2.3283064365386963e-10 <= tolerance) {
          dVar9 = tolerance;
        }
        lVar7 = 0;
        do {
          dVar10 = ON_GrevilleAbcissa(this->m_order[0],this->m_knot[0] + lVar7);
          d = ON_Interval::NormalizedParameterAt(local_188,dVar10);
          if (0 < this->m_cv_count[1]) {
            lVar3 = 0;
            do {
              t = ON_GrevilleAbcissa(this->m_order[1],this->m_knot[1] + lVar3);
              d_00 = ON_Interval::NormalizedParameterAt(local_188 + 1,t);
              if (0 < this->m_cv_count[2]) {
                lVar8 = 0;
                lVar4 = 0;
                do {
                  dVar11 = ON_GrevilleAbcissa(this->m_order[2],
                                              (double *)((long)this->m_knot[2] + lVar8));
                  d_01 = ON_Interval::NormalizedParameterAt(local_188 + 2,dVar11);
                  Evaluate(this,dVar10,t,dVar11,0,3,&local_138.x,0,(int *)0x0);
                  ::operator*(&local_78,((1.0 - d) - d_00) - d_01,&local_d8);
                  ::operator*(&local_90,d,&local_f0);
                  ON_3dPoint::operator+(&local_60,&local_78,&local_90);
                  ::operator*(&local_a8,d_00,&local_108);
                  ON_3dPoint::operator+(&local_48,&local_60,&local_a8);
                  ::operator*(&local_c0,d_01,&local_120);
                  ON_3dPoint::operator+(&local_150,&local_48,&local_c0);
                  local_1a8.z = local_150.z;
                  local_1a8.x = local_150.x;
                  local_1a8.y = local_150.y;
                  dVar11 = ON_3dPoint::DistanceTo(&local_1a8,&local_138);
                  if (dVar9 < dVar11) goto LAB_0054d2ed;
                  lVar4 = lVar4 + 1;
                  lVar8 = lVar8 + 8;
                } while (lVar4 < this->m_cv_count[2]);
              }
              lVar3 = lVar3 + 1;
            } while (lVar3 < this->m_cv_count[1]);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < this->m_cv_count[0]);
        bVar6 = true;
      }
    }
  }
  return bVar6;
}

Assistant:

bool ON_NurbsCage::IsParallelogram(double tolerance) const
{
  int i,j,k;
  double r,s,t;
  double x,y,z,dist;
  ON_Interval d[3];
  ON_3dPoint P, X, Y, Z, Q, B;

  bool rc = IsValid()?true:false;

  for ( i = 0; i < 3 && rc; i++ )
  {
    d[i] = Domain(i);
    rc = (    d[i][0] == m_knot[i][0]
           && d[i][1] == m_knot[i][m_cv_count[i]+m_order[i]-3]
           );
  }

  if (rc)
  {
    GetCV(0,0,0,P);
    GetCV(m_cv_count[0]-1,0,0,X);
    GetCV(0,m_cv_count[1]-1,0,Y);
    GetCV(0,0,m_cv_count[2]-1,Z);

    if ( tolerance < ON_ZERO_TOLERANCE )
      tolerance = ON_ZERO_TOLERANCE;

    for ( i = 0; i < m_cv_count[0]; i++ )
    {
      r = ON_GrevilleAbcissa(m_order[0],m_knot[0]+i);
      x = d[0].NormalizedParameterAt(r);
      for ( j = 0; j < m_cv_count[1]; j++ )
      {
        s = ON_GrevilleAbcissa(m_order[1],m_knot[1]+j);
        y = d[1].NormalizedParameterAt(s);
        for ( k = 0; k < m_cv_count[2]; k++ )
        {
          t = ON_GrevilleAbcissa(m_order[2],m_knot[2]+k);
          z = d[2].NormalizedParameterAt(t);
          Evaluate(r,s,t,0,3,&Q.x);
          B = (1.0-x-y-z)*P + x*X + y*Y + z*Z;
          dist = B.DistanceTo(Q);
          if ( dist > tolerance )
            return false;          
        }
      }
    }
  }

  return rc;
}